

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O0

int ffppx(fitsfile *fptr,int datatype,long *firstpix,LONGLONG nelem,void *array,int *status)

{
  long firstelem_00;
  LONGLONG local_a8;
  LONGLONG naxes [9];
  LONGLONG dimsize;
  LONGLONG firstelem;
  long group;
  int ii;
  int naxis;
  int *status_local;
  void *array_local;
  LONGLONG nelem_local;
  long *firstpix_local;
  fitsfile *pfStack_18;
  int datatype_local;
  fitsfile *fptr_local;
  
  naxes[8] = 1;
  if (*status < 1) {
    _ii = status;
    status_local = (int *)array;
    array_local = (void *)nelem;
    nelem_local = (LONGLONG)firstpix;
    firstpix_local._4_4_ = datatype;
    pfStack_18 = fptr;
    ffgidm(fptr,(int *)((long)&group + 4),status);
    ffgiszll(pfStack_18,9,&local_a8,_ii);
    dimsize = 0;
    for (group._0_4_ = 0; (int)group < group._4_4_; group._0_4_ = (int)group + 1) {
      dimsize = (*(long *)(nelem_local + (long)(int)group * 8) + -1) * naxes[8] + dimsize;
      naxes[8] = naxes[(long)(int)group + -1] * naxes[8];
    }
    firstelem_00 = dimsize + 1;
    if (firstpix_local._4_4_ == 0xb) {
      ffpprb(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(uchar *)status_local,_ii);
    }
    else if (firstpix_local._4_4_ == 0xc) {
      ffpprsb(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(char *)status_local,_ii);
    }
    else if (firstpix_local._4_4_ == 0x14) {
      ffpprui(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(unsigned_short *)status_local,_ii);
    }
    else if (firstpix_local._4_4_ == 0x15) {
      ffppri(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(short *)status_local,_ii);
    }
    else if (firstpix_local._4_4_ == 0x1e) {
      ffppruk(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(uint *)status_local,_ii);
    }
    else if (firstpix_local._4_4_ == 0x1f) {
      ffpprk(pfStack_18,1,firstelem_00,(LONGLONG)array_local,status_local,_ii);
    }
    else if (firstpix_local._4_4_ == 0x28) {
      ffppruj(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(unsigned_long *)status_local,_ii);
    }
    else if (firstpix_local._4_4_ == 0x29) {
      ffpprj(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(long *)status_local,_ii);
    }
    else if (firstpix_local._4_4_ == 0x50) {
      ffpprujj(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(ULONGLONG *)status_local,_ii);
    }
    else if (firstpix_local._4_4_ == 0x51) {
      ffpprjj(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(LONGLONG *)status_local,_ii);
    }
    else if (firstpix_local._4_4_ == 0x2a) {
      ffppre(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(float *)status_local,_ii);
    }
    else if (firstpix_local._4_4_ == 0x52) {
      ffpprd(pfStack_18,1,firstelem_00,(LONGLONG)array_local,(double *)status_local,_ii);
    }
    else {
      *_ii = 0x19a;
    }
    fptr_local._4_4_ = *_ii;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffppx(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int  datatype,   /* I - datatype of the value                   */
            long  *firstpix, /* I - coord of  first pixel to write(1 based) */
            LONGLONG  nelem,     /* I - number of values to write               */
            void  *array,    /* I - array of values that are written        */
            int  *status)    /* IO - error status                           */
/*
  Write an array of pixels to the primary array.  The datatype of the
  input array is defined by the 2nd argument. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written). 
  
  This routine is simillar to ffppr, except it supports writing to 
  large images with more than 2**31 pixels.
*/
{
    int naxis, ii;
    long group = 1;
    LONGLONG firstelem, dimsize = 1, naxes[9];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgiszll(fptr, 9, naxes, status);

    firstelem = 0;
    for (ii=0; ii < naxis; ii++)
    {
        firstelem += ((firstpix[ii] - 1) * dimsize);
        dimsize *= naxes[ii];
    }
    firstelem++;

    if (datatype == TBYTE)
    {
      ffpprb(fptr, group, firstelem, nelem, (unsigned char *) array, status);
    }
    else if (datatype == TSBYTE)
    {
      ffpprsb(fptr, group, firstelem, nelem, (signed char *) array, status);
    }
    else if (datatype == TUSHORT)
    {
      ffpprui(fptr, group, firstelem, nelem, (unsigned short *) array,
              status);
    }
    else if (datatype == TSHORT)
    {
      ffppri(fptr, group, firstelem, nelem, (short *) array, status);
    }
    else if (datatype == TUINT)
    {
      ffppruk(fptr, group, firstelem, nelem, (unsigned int *) array, status);
    }
    else if (datatype == TINT)
    {
      ffpprk(fptr, group, firstelem, nelem, (int *) array, status);
    }
    else if (datatype == TULONG)
    {
      ffppruj(fptr, group, firstelem, nelem, (unsigned long *) array, status);
    }
    else if (datatype == TLONG)
    {
      ffpprj(fptr, group, firstelem, nelem, (long *) array, status);
    }
    else if (datatype == TULONGLONG)
    {
      ffpprujj(fptr, group, firstelem, nelem, (ULONGLONG *) array, status);
    }
    else if (datatype == TLONGLONG)
    {
      ffpprjj(fptr, group, firstelem, nelem, (LONGLONG *) array, status);
    }
    else if (datatype == TFLOAT)
    {
      ffppre(fptr, group, firstelem, nelem, (float *) array, status);
    }
    else if (datatype == TDOUBLE)
    {
      ffpprd(fptr, group, firstelem, nelem, (double *) array, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}